

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

void cuddCacheInsert2(DdManager *table,DD_CTFP op,DdNode *f,DdNode *g,DdNode *data)

{
  uint uVar1;
  DdCache *pDVar2;
  DdCache *entry;
  uint hash;
  int posn;
  DdNode *data_local;
  DdNode *g_local;
  DdNode *f_local;
  DD_CTFP op_local;
  DdManager *table_local;
  
  uVar1 = ((((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1) + (int)op
           ) * 0xc00005 +
          ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) * 0x40f1f9
  ;
  pDVar2 = table->cache + (int)(uVar1 >> ((byte)table->cacheShift & 0x1f));
  if (pDVar2->data != (DdNode *)0x0) {
    table->cachecollisions = table->cachecollisions + 1.0;
  }
  table->cacheinserts = table->cacheinserts + 1.0;
  pDVar2->f = f;
  pDVar2->g = g;
  pDVar2->h = (ptruint)op;
  pDVar2->data = data;
  pDVar2->hash = uVar1;
  return;
}

Assistant:

void
cuddCacheInsert2(
  DdManager * table,
  DD_CTFP op,
  DdNode * f,
  DdNode * g,
  DdNode * data)
{
    int posn;
    unsigned hash;
    register DdCache *entry;

    hash = ddCHash2_(op,cuddF2L(f),cuddF2L(g));
//    posn = ddCHash2(op,cuddF2L(f),cuddF2L(g),table->cacheShift);
    posn = hash >> table->cacheShift;
    entry = &table->cache[posn];

    if (entry->data != NULL) {
        table->cachecollisions++;
    }
    table->cacheinserts++;

    entry->f = f;
    entry->g = g;
    entry->h = (ptruint) op;
    entry->data = data;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif
    entry->hash = hash;

}